

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.h
# Opt level: O2

void * tommy_hashlin_search(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  tommy_node_struct *ptVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = tommy_hashlin_bucket(hashlin,hash);
  pvVar4 = (void *)0x0;
  do {
    if (ptVar3 == (tommy_hashlin_node *)0x0) {
LAB_0010baff:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return pvVar4;
      }
      __stack_chk_fail();
    }
    if (ptVar3->key == hash) {
      iVar2 = (*(code *)cmp)(cmp_arg,ptVar3->data);
      if (iVar2 == 0) {
        pvVar4 = ptVar3->data;
        goto LAB_0010baff;
      }
    }
    ptVar3 = ptVar3->next;
  } while( true );
}

Assistant:

tommy_inline void* tommy_hashlin_search(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node* i = tommy_hashlin_bucket(hashlin, hash);

	while (i) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (i->key == hash && cmp(cmp_arg, i->data) == 0)
			return i->data;
		i = i->next;
	}
	return 0;
}